

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublylinkedlist.c
# Opt level: O0

void DList_InsertTailList(PDLIST_ENTRY ListHead,PDLIST_ENTRY Entry)

{
  DLIST_ENTRY_TAG *pDVar1;
  PDLIST_ENTRY Blink;
  PDLIST_ENTRY Entry_local;
  PDLIST_ENTRY ListHead_local;
  
  pDVar1 = ListHead->Blink;
  Entry->Flink = ListHead;
  Entry->Blink = pDVar1;
  pDVar1->Flink = Entry;
  ListHead->Blink = Entry;
  return;
}

Assistant:

void
DList_InsertTailList(
    PDLIST_ENTRY ListHead,
    PDLIST_ENTRY Entry
)
{
    PDLIST_ENTRY Blink;

    /* Codes_SRS_DLIST_06_006: [DListInsertTailList shall place the DLIST_ENTRY at the end of the list defined by the listHead parameter.] */
    Blink = ListHead->Blink;
    Entry->Flink = ListHead;
    Entry->Blink = Blink;
    Blink->Flink = Entry;
    ListHead->Blink = Entry;
    return;
}